

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalPdu.cpp
# Opt level: O0

int __thiscall DIS::SignalPdu::getMarshalledSize(SignalPdu *this)

{
  int iVar1;
  size_type sVar2;
  int marshalSize;
  SignalPdu *this_local;
  
  iVar1 = RadioCommunicationsFamilyPdu::getMarshalledSize(&this->super_RadioCommunicationsFamilyPdu)
  ;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_data);
  return iVar1 + 0xc + (int)sVar2;
}

Assistant:

int SignalPdu::getMarshalledSize() const
{
  auto marshalSize = 0;

  marshalSize = RadioCommunicationsFamilyPdu::getMarshalledSize();
  marshalSize += 2; // _encodingScheme
  marshalSize += 2; // _tdlType
  marshalSize += 4; // _sampleRate
  marshalSize += 2; // _dataLength
  marshalSize += 2; // _samples
  marshalSize += _data.size();

  return marshalSize;
}